

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_gate.c
# Opt level: O0

void dispatch_message(skynet_context *ctx,skynet_message *msg)

{
  uint type_00;
  int iVar1;
  ulong sz_00;
  size_t sz;
  int type;
  skynet_message *msg_local;
  skynet_context *ctx_local;
  
  if ((ctx->init & 1U) != 0) {
    pthread_setspecific(G_NODE.handle_key,(void *)(ulong)ctx->handle);
    type_00 = (uint)(byte)(msg->sz >> 0x38);
    sz_00 = msg->sz & 0xffffffffffffff;
    if (ctx->logfile != (FILE *)0x0) {
      skynet_log_output(ctx->logfile,msg->source,type_00,msg->session,msg->data,sz_00);
    }
    iVar1 = (*ctx->cb)(ctx,ctx->cb_ud,type_00,msg->session,msg->source,msg->data,sz_00);
    if (iVar1 == 0) {
      free(msg->data);
    }
    return;
  }
  __assert_fail("ctx->init",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_server.c"
                ,0xfb,"void dispatch_message(struct skynet_context *, struct skynet_message *)");
}

Assistant:

static void
dispatch_message(struct gate *g, struct connection *c, int id, void * data, int sz) {
	databuffer_push(&c->buffer,&g->mp, data, sz);
	for (;;) {
		int size = databuffer_readheader(&c->buffer, &g->mp, g->header_size);
		if (size < 0) {
			return;
		} else if (size > 0) {
			if (size >= 0x1000000) {
				struct skynet_context * ctx = g->ctx;
				databuffer_clear(&c->buffer,&g->mp);
				skynet_socket_close(ctx, id);
				skynet_error(ctx, "Recv socket message > 16M");
				return;
			} else {
				_forward(g, c, size);
				databuffer_reset(&c->buffer);
			}
		}
	}
}